

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O2

void __thiscall
tchecker::algorithms::reach::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_reach::zg_reach::graph_t>
::run_from_waiting(algorithm_t<tchecker::zg::zg_t,_tchecker::tck_reach::zg_reach::graph_t> *this,
                  zg_t *ts,graph_t *graph,
                  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels,
                  waiting_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>
                  *waiting,stats_t *stats)

{
  pointer ptVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  unsigned_long *puVar4;
  make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>
  *pmVar5;
  bool *pbVar6;
  make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL> *args;
  pointer this_00;
  tuple<bool,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>
  tVar7;
  node_sptr_t node;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  sst;
  graph_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t,tchecker::tck_reach::zg_reach::node_hash_t,tchecker::tck_reach::zg_reach::node_equal_to_t>
  local_40 [8];
  char local_38;
  
  sst.
  super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sst.
  super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sst.
  super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    iVar3 = (*waiting->_vptr_waiting_t[2])(waiting);
    if ((char)iVar3 != '\0') break;
    iVar3 = (*waiting->_vptr_waiting_t[6])(waiting);
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
    ::intrusive_shared_ptr_t
              (&node,(intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
                      *)CONCAT44(extraout_var,iVar3));
    (*waiting->_vptr_waiting_t[5])(waiting);
    puVar4 = stats_t::visited_states(stats);
    *puVar4 = *puVar4 + 1;
    bVar2 = accepting(this,&node,ts,labels);
    if (bVar2) {
      pmVar5 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
               ::operator->(&node);
      tchecker::graph::node_flags_t::final
                (&(pmVar5->
                  super_node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>
                  ).super_node_t.super_node_flags_t,true);
      pbVar6 = stats_t::reachable(stats);
      *pbVar6 = true;
    }
    else {
      pmVar5 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
               ::operator->(&node);
      intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
      ::intrusive_shared_ptr_t
                ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                  *)local_40,
                 &(pmVar5->
                  super_node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>
                  ).super_node_t.super_node_zg_state_t._state);
      zg::zg_t::next(ts,(const_state_sptr_t *)local_40,&sst,1);
      intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t
                ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                  *)local_40);
      ptVar1 = sst.
               super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_00 = sst.
                     super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_00 != ptVar1;
          this_00 = this_00 + 1) {
        tVar7 = tchecker::graph::reachability::
                graph_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t,tchecker::tck_reach::zg_reach::node_hash_t,tchecker::tck_reach::zg_reach::node_equal_to_t>
                ::
                add_node<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>&>
                          (local_40,(intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                                     *)graph);
        if (local_38 == '\x01') {
          (*waiting->_vptr_waiting_t[4])
                    (waiting,local_40,
                     tVar7.
                     super__Tuple_impl<0UL,_bool,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>
                     ._8_8_);
        }
        args = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
               ::operator*((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
                            *)this_00);
        tchecker::graph::reachability::
        graph_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t,tchecker::tck_reach::zg_reach::node_hash_t,tchecker::tck_reach::zg_reach::node_equal_to_t>
        ::add_edge<tchecker::make_shared_t<tchecker::zg::transition_t,unsigned_long,1ul>&>
                  ((graph_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t,tchecker::tck_reach::zg_reach::node_hash_t,tchecker::tck_reach::zg_reach::node_equal_to_t>
                    *)graph,&node,(node_sptr_t *)local_40,args);
        puVar4 = stats_t::visited_transitions(stats);
        *puVar4 = *puVar4 + 1;
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t
                  ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
                    *)local_40);
      }
      std::
      vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
      ::clear(&sst);
    }
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&node);
  } while (!bVar2);
  (*waiting->_vptr_waiting_t[3])(waiting);
  std::
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ::~vector(&sst);
  return;
}

Assistant:

void run_from_waiting(TS & ts, GRAPH & graph, boost::dynamic_bitset<> const & labels,
                        tchecker::waiting::waiting_t<typename GRAPH::node_sptr_t> & waiting,
                        tchecker::algorithms::reach::stats_t & stats)
  {
    std::vector<typename TS::sst_t> sst;

    while (!waiting.empty()) {
      node_sptr_t node = waiting.first();
      waiting.remove_first();

      ++stats.visited_states();

      if (accepting(node, ts, labels)) {
        node->final(true);
        stats.reachable() = true;
        break;
      }

      ts.next(node->state_ptr(), sst);
      for (auto && [status, s, t] : sst) {
        auto && [is_new_node, next_node] = graph.add_node(s);
        if (is_new_node)
          waiting.insert(next_node);
        graph.add_edge(node, next_node, *t);

        ++stats.visited_transitions();
      }
      sst.clear();
    }

    waiting.clear();
  }